

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall Cube::setupRightFace(Cube *this)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  fVar1 = this->y;
  fVar4 = this->h + fVar1;
  this->positionData[0x37] = fVar1;
  uVar2 = this->z;
  uVar3 = this->l;
  fVar5 = this->b + (float)uVar2;
  fVar6 = this->x + (float)uVar3;
  this->positionData[0x36] = fVar6;
  *(ulong *)(this->positionData + 0x38) = CONCAT44(fVar6,fVar5);
  this->positionData[0x3a] = fVar1;
  this->positionData[0x3b] = (float)uVar2;
  this->positionData[0x3c] = fVar6;
  this->positionData[0x3d] = fVar4;
  this->positionData[0x3e] = (float)uVar2;
  this->positionData[0x3f] = fVar6;
  this->positionData[0x40] = fVar1;
  *(ulong *)(this->positionData + 0x41) = CONCAT44(fVar6,fVar5);
  this->positionData[0x43] = fVar4;
  this->positionData[0x44] = (float)uVar2;
  this->positionData[0x45] = fVar6;
  this->positionData[0x46] = fVar4;
  this->positionData[0x47] = fVar5;
  return;
}

Assistant:

void setupRightFace() {
        float rightFace[]={

            x+l,y,z+b,
            x+l,y,z,
            x+l,y+h,z,
            x+l,y,z+b,
            x+l,y+h,z,
            x+l,y+h,z+b
        };

        arrayCopy(rightFace,positionData,54);
    }